

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCongruenceClosure.cpp
# Opt level: O0

void __thiscall
DP::SimpleCongruenceClosure::getUnsatCore
          (SimpleCongruenceClosure *this,LiteralStack *res,uint coreIndex)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CEq *pCVar4;
  uint in_EDX;
  long in_RDI;
  CPair cp2;
  CPair cp1;
  CEq *prem;
  uint proofStepConst;
  CPair curr;
  IntUnionFind explained;
  CEq unsatEq;
  Stack<std::pair<unsigned_int,_unsigned_int>_> *in_stack_fffffffffffffef8;
  pair<unsigned_int,_unsigned_int> in_stack_ffffffffffffff00;
  ConstInfo *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  ConstInfo *in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff2c;
  IntUnionFind *in_stack_ffffffffffffff30;
  pair<unsigned_int,_unsigned_int> local_b8;
  pair<unsigned_int,_unsigned_int> local_b0;
  CPair local_a8;
  CPair local_a0;
  CEq *local_98;
  uint local_8c;
  pair<unsigned_int,_unsigned_int> local_88;
  pair<unsigned_int,_unsigned_int> local_44 [2];
  undefined8 local_30;
  undefined8 local_28;
  Literal *local_20;
  
  pCVar4 = Lib::Stack<DP::SimpleCongruenceClosure::CEq>::operator[]
                     ((Stack<DP::SimpleCongruenceClosure::CEq> *)(in_RDI + 0xd0),(ulong)in_EDX);
  local_30._0_4_ = pCVar4->c1;
  local_30._4_4_ = pCVar4->c2;
  local_28 = *(undefined8 *)&pCVar4->foOrigin;
  local_20 = pCVar4->foPremise;
  if (local_20 != (Literal *)0x0) {
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)in_stack_ffffffffffffff00,
               (Literal *)in_stack_fffffffffffffef8);
  }
  if ((getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::toExplain == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::
                                   toExplain), iVar2 != 0)) {
    Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::Stack
              ((Stack<std::pair<unsigned_int,_unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (size_t)in_stack_ffffffffffffff08);
    __cxa_atexit(Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::~Stack,&getUnsatCore::toExplain
                 ,&__dso_handle);
    __cxa_guard_release(&getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::toExplain);
  }
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
            (local_44,(uint *)&local_30,(uint *)((long)&local_30 + 4));
  Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::push
            (in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
  getMaxConst((SimpleCongruenceClosure *)0x29ee54);
  Lib::IntUnionFind::IntUnionFind(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  if ((getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::pathStack == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::
                                   pathStack), iVar2 != 0)) {
    Lib::Stack<unsigned_int>::Stack
              ((Stack<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (size_t)in_stack_ffffffffffffff08);
    __cxa_atexit(Lib::Stack<unsigned_int>::~Stack,&getUnsatCore::pathStack,&__dso_handle);
    __cxa_guard_release(&getUnsatCore(Lib::Stack<Kernel::Literal*>&,unsigned_int)::pathStack);
  }
  while (bVar1 = Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::isNonEmpty
                           (&getUnsatCore::toExplain), bVar1) {
    local_88 = Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::pop(&getUnsatCore::toExplain);
    iVar2 = Lib::IntUnionFind::root
                      ((IntUnionFind *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                       ,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    iVar3 = Lib::IntUnionFind::root
                      ((IntUnionFind *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                       ,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    if (iVar2 != iVar3) {
      Lib::Stack<unsigned_int>::reset(&getUnsatCore::pathStack);
      collectUnifyingPath((SimpleCongruenceClosure *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                          (uint)in_stack_ffffffffffffff08,
                          (Stack<unsigned_int> *)in_stack_ffffffffffffff00);
      while( true ) {
        bVar1 = Lib::Stack<unsigned_int>::isNonEmpty(&getUnsatCore::pathStack);
        in_stack_ffffffffffffff24 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff24);
        if (!bVar1) break;
        in_stack_ffffffffffffff20 = Lib::Stack<unsigned_int>::pop(&getUnsatCore::pathStack);
        local_8c = in_stack_ffffffffffffff20;
        in_stack_ffffffffffffff18 =
             Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::operator[]
                       ((DArray<DP::SimpleCongruenceClosure::ConstInfo> *)(in_RDI + 0x10),
                        (ulong)in_stack_ffffffffffffff20);
        local_98 = &in_stack_ffffffffffffff18->predecessorPremise;
        in_stack_ffffffffffffff14 =
             Lib::IntUnionFind::root
                       ((IntUnionFind *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        in_stack_ffffffffffffff10 =
             Lib::IntUnionFind::root
                       ((IntUnionFind *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        if (in_stack_ffffffffffffff14 != in_stack_ffffffffffffff10) {
          if ((local_98->foOrigin & 1U) == 0) {
            in_stack_ffffffffffffff08 =
                 Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::operator[]
                           ((DArray<DP::SimpleCongruenceClosure::ConstInfo> *)(in_RDI + 0x10),
                            (ulong)local_98->c1);
            local_a0 = in_stack_ffffffffffffff08->namedPair;
            in_stack_ffffffffffffff00 =
                 (pair<unsigned_int,_unsigned_int>)
                 Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::operator[]
                           ((DArray<DP::SimpleCongruenceClosure::ConstInfo> *)(in_RDI + 0x10),
                            (ulong)local_98->c2);
            local_a8 = *(CPair *)((long)in_stack_ffffffffffffff00 + 0x18);
            std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                      (&local_b0,&local_a0.first,&local_a8.first);
            Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::push
                      (in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
            std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                      (&local_b8,&local_a0.second,&local_a8.second);
            Lib::Stack<std::pair<unsigned_int,_unsigned_int>_>::push
                      (in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
          }
          else if (local_98->foPremise != (Literal *)0x0) {
            Lib::Stack<Kernel::Literal_*>::push
                      ((Stack<Kernel::Literal_*> *)in_stack_ffffffffffffff00,
                       (Literal *)in_stack_fffffffffffffef8);
          }
          Lib::IntUnionFind::doUnion
                    ((IntUnionFind *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00.second,
                     in_stack_ffffffffffffff00.first);
        }
      }
    }
  }
  Lib::IntUnionFind::~IntUnionFind((IntUnionFind *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

void SimpleCongruenceClosure::getUnsatCore(LiteralStack& res, unsigned coreIndex)
{
  ASS(res.isEmpty());
  ASS_L(coreIndex,_unsatEqs.size());

  CEq unsatEq = _unsatEqs[coreIndex];

  ASS(unsatEq.foOrigin);
  if(unsatEq.foPremise) {
    res.push(unsatEq.foPremise);
  }

  static Stack<CPair> toExplain;
  toExplain.push(CPair(unsatEq.c1, unsatEq.c2));
  ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));

  IntUnionFind explained(getMaxConst()+1);
  static Stack<unsigned> pathStack;

  while(toExplain.isNonEmpty()) {
    CPair curr = toExplain.pop();
    ASS_EQ(deref(curr.first), deref(curr.second));

    if(explained.root(curr.first)==explained.root(curr.second)) {
      //we've already explained this equality
      continue;
    }
    pathStack.reset();
    // put into pathStack constants whose premises imply the equality
    collectUnifyingPath(curr.first, curr.second, pathStack);
    while(pathStack.isNonEmpty()) {
      unsigned proofStepConst = pathStack.pop();
      CEq& prem = _cInfos[proofStepConst].predecessorPremise;
      if(explained.root(prem.c1)==explained.root(prem.c2)) {
        //we've already explained this equality
        continue;
      }
      if(prem.foOrigin) {
	if(prem.foPremise) {
	  res.push(prem.foPremise);
	} // Martin: this should be only null for the "built-in" dis-equality (_posLitConst != _negLitConst)
      }
      else {
	//the equality was implied by congruence between the following two pairs:
	CPair cp1 = _cInfos[prem.c1].namedPair;
	CPair cp2 = _cInfos[prem.c2].namedPair;
	ASS_NEQ(cp1.first,0);
	ASS_NEQ(cp1.second,0);
	ASS_NEQ(cp2.first,0);
	ASS_NEQ(cp2.second,0);
	toExplain.push(CPair(cp1.first, cp2.first));
	ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));
	toExplain.push(CPair(cp1.second, cp2.second));
	ASS_EQ(deref(toExplain.top().first), deref(toExplain.top().second));
      }
      explained.doUnion(prem.c1, prem.c2);
    }
  }
}